

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

SpectrumCheckerboardTexture *
pbrt::SpectrumCheckerboardTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,
          SpectrumType spectrumType,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  TextureParameterDictionary *in_RSI;
  memory_resource *in_R8;
  TextureMapping3D map_1;
  TextureMapping2D map;
  SpectrumTexture tex2;
  SpectrumTexture tex1;
  Spectrum one;
  Spectrum zero;
  int dim;
  FileLoc *in_stack_00000390;
  Transform *in_stack_00000398;
  ParameterDictionary *in_stack_000003a0;
  Allocator in_stack_000003a8;
  string *in_stack_fffffffffffffe78;
  TextureParameterDictionary *in_stack_fffffffffffffe80;
  TextureParameterDictionary *this;
  double *in_stack_fffffffffffffe88;
  SpectrumTexture *args_2;
  polymorphic_allocator<std::byte> *this_00;
  TextureParameterDictionary *args;
  polymorphic_allocator<std::byte> *this_01;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  SpectrumType in_stack_fffffffffffffeec;
  Spectrum *in_stack_fffffffffffffef0;
  string *in_stack_fffffffffffffef8;
  FileLoc *in_stack_ffffffffffffff00;
  Allocator in_stack_ffffffffffffff08;
  ParameterDictionary *in_stack_ffffffffffffff10;
  Allocator in_stack_ffffffffffffff18;
  undefined8 local_b9;
  undefined8 local_90;
  undefined8 local_80;
  allocator<char> local_59;
  string local_58 [36];
  int local_34;
  TextureParameterDictionary *local_20;
  polymorphic_allocator<std::byte> local_10;
  SpectrumCheckerboardTexture *local_8;
  
  __s = &local_59;
  local_20 = in_RSI;
  local_10.memoryResource = in_R8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffec0,(char *)__s,(allocator<char> *)in_RSI);
  iVar1 = TextureParameterDictionary::GetOneInt
                    (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,0);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  local_34 = iVar1;
  if ((iVar1 == 2) || (iVar1 == 3)) {
    local_80 = 0;
    this_00 = &local_10;
    pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,double>
              (this_00,in_stack_fffffffffffffe88);
    Spectrum::TaggedPointer<pbrt::ConstantSpectrum>
              ((Spectrum *)in_stack_fffffffffffffe80,(ConstantSpectrum *)in_stack_fffffffffffffe78);
    local_90 = 0x3ff0000000000000;
    pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,double>
              (this_00,in_stack_fffffffffffffe88);
    Spectrum::TaggedPointer<pbrt::ConstantSpectrum>
              ((Spectrum *)in_stack_fffffffffffffe80,(ConstantSpectrum *)in_stack_fffffffffffffe78);
    this_01 = (polymorphic_allocator<std::byte> *)&local_b9;
    args = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffec0,(char *)__s,(allocator<char> *)in_RSI);
    Spectrum::Spectrum((Spectrum *)in_stack_fffffffffffffe80,(Spectrum *)in_stack_fffffffffffffe78);
    TextureParameterDictionary::GetSpectrumTexture
              ((TextureParameterDictionary *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_ffffffffffffff08);
    std::__cxx11::string::~string((string *)((long)&local_b9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    args_2 = (SpectrumTexture *)&stack0xffffffffffffff07;
    this = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffec0,(char *)__s,(allocator<char> *)in_RSI);
    Spectrum::Spectrum((Spectrum *)this,(Spectrum *)in_stack_fffffffffffffe78);
    TextureParameterDictionary::GetSpectrumTexture
              ((TextureParameterDictionary *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (Spectrum *)local_10.memoryResource,in_stack_fffffffffffffeec,
               in_stack_ffffffffffffff08);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff07);
    if (local_34 == 2) {
      TextureParameterDictionary::operator_cast_to_ParameterDictionary_(local_20);
      TextureMapping2D::Create
                (in_stack_000003a0,in_stack_00000398,in_stack_00000390,in_stack_000003a8);
      local_8 = pstd::pmr::polymorphic_allocator<std::byte>::
                new_object<pbrt::SpectrumCheckerboardTexture,pbrt::TextureMapping2D&,decltype(nullptr),pbrt::SpectrumTexture&,pbrt::SpectrumTexture&>
                          (this_01,(TextureMapping2D *)args,&this_00->memoryResource,args_2,
                           (SpectrumTexture *)this);
    }
    else {
      TextureParameterDictionary::operator_cast_to_ParameterDictionary_(local_20);
      TextureMapping3D::Create
                (in_stack_ffffffffffffff10,(Transform *)in_stack_ffffffffffffff08.memoryResource,
                 in_stack_ffffffffffffff00,in_stack_ffffffffffffff18);
      local_8 = pstd::pmr::polymorphic_allocator<std::byte>::
                new_object<pbrt::SpectrumCheckerboardTexture,decltype(nullptr),pbrt::TextureMapping3D&,pbrt::SpectrumTexture&,pbrt::SpectrumTexture&>
                          (this_01,&args->dict,(TextureMapping3D *)this_00,args_2,
                           (SpectrumTexture *)this);
    }
  }
  else {
    Error<int&>((FileLoc *)in_stack_fffffffffffffec0,(char *)__s,(int *)in_RSI);
    local_8 = (SpectrumCheckerboardTexture *)0x0;
  }
  return local_8;
}

Assistant:

SpectrumCheckerboardTexture *SpectrumCheckerboardTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    SpectrumType spectrumType, const FileLoc *loc, Allocator alloc) {
    int dim = parameters.GetOneInt("dimension", 2);
    if (dim != 2 && dim != 3) {
        Error(loc, "%d dimensional checkerboard texture not supported", dim);
        return nullptr;
    }

    Spectrum zero = alloc.new_object<ConstantSpectrum>(0.);
    Spectrum one = alloc.new_object<ConstantSpectrum>(1.);

    SpectrumTexture tex1 =
        parameters.GetSpectrumTexture("tex1", one, spectrumType, alloc);
    SpectrumTexture tex2 =
        parameters.GetSpectrumTexture("tex2", zero, spectrumType, alloc);
    if (dim == 2) {
        // Initialize 2D texture mapping _map_ from _tp_
        TextureMapping2D map =
            TextureMapping2D::Create(parameters, renderFromTexture, loc, alloc);

        return alloc.new_object<SpectrumCheckerboardTexture>(map, nullptr, tex1, tex2);
    } else {
        // Initialize 3D texture mapping _map_ from _tp_
        TextureMapping3D map =
            TextureMapping3D::Create(parameters, renderFromTexture, loc, alloc);
        return alloc.new_object<SpectrumCheckerboardTexture>(nullptr, map, tex1, tex2);
    }
}